

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_state_get_resp(connectdata *conn,int ftpcode,ftpstate instate)

{
  connectdata *pcVar1;
  CURLcode CVar2;
  char *pcVar3;
  ushort **ppuVar4;
  bool bVar5;
  ftp_conn *ftpc;
  long lStack_58;
  _Bool connected;
  long in;
  char *bytes;
  curl_off_t size;
  char *buf;
  FTP *ftp;
  SessionHandle *data;
  ftpstate local_20;
  CURLcode result;
  ftpstate instate_local;
  int ftpcode_local;
  connectdata *conn_local;
  
  data._4_4_ = CURLE_OK;
  ftp = (FTP *)conn->data;
  buf = (char *)(((SessionHandle *)ftp)->req).protop;
  size = (curl_off_t)(((SessionHandle *)ftp)->state).buffer;
  local_20 = instate;
  result = ftpcode;
  _instate_local = conn;
  if ((ftpcode == 0x96) || (ftpcode == 0x7d)) {
    bytes = (char *)0xffffffffffffffff;
    if ((instate == FTP_LIST) ||
       ((((((SessionHandle *)ftp)->set).prefer_ascii & 1U) != 0 || (0 < *(long *)(buf + 0x20))))) {
      if (-1 < *(long *)(buf + 0x20)) {
        bytes = *(char **)(buf + 0x20);
      }
    }
    else {
      pcVar3 = strstr((char *)size," bytes");
      in = (long)(pcVar3 + -1);
      if (pcVar3 != (char *)0x0) {
        lStack_58 = in - size;
        while( true ) {
          lStack_58 = lStack_58 + -1;
          if ((lStack_58 == 0) || (*(char *)in == '(')) goto LAB_0094d952;
          ppuVar4 = __ctype_b_loc();
          if (((*ppuVar4)[(int)(uint)*(byte *)in] & 0x800) == 0) break;
          in = in + -1;
        }
        in = 0;
LAB_0094d952:
        pcVar3 = (char *)(in + 1);
        bVar5 = in != 0;
        in = (long)pcVar3;
        if (bVar5) {
          bytes = (char *)strtol(pcVar3,(char **)0x0,0);
        }
      }
    }
    if (((long)ftp[3].passwd < (long)bytes) && (0 < (long)ftp[3].passwd)) {
      bytes = ftp[3].passwd;
      ftp[3].bytecountp = (curl_off_t *)bytes;
    }
    else if ((local_20 != FTP_LIST) && ((ftp[0x1c].downloadsize & 0x1000000) != 0)) {
      bytes = (char *)0xffffffffffffffff;
    }
    Curl_infof((SessionHandle *)ftp,"Maxdownload = %ld\n",ftp[3].passwd);
    if (local_20 != FTP_LIST) {
      Curl_infof((SessionHandle *)ftp,"Getting file with size: %ld\n",bytes);
    }
    (_instate_local->proto).ftpc.state_saved = local_20;
    (_instate_local->proto).ftpc.retr_size_saved = (curl_off_t)bytes;
    if ((ftp[0x1c].downloadsize & 0x1000000000000) == 0) {
      CVar2 = InitiateTransfer(_instate_local);
      return CVar2;
    }
    data._4_4_ = AllowServerConnect(_instate_local,(_Bool *)((long)&ftpc + 7));
    pcVar1 = _instate_local;
    if (data._4_4_ != CURLE_OK) {
      return data._4_4_;
    }
    if ((ftpc._7_1_ & 1) == 0) {
      Curl_infof((SessionHandle *)ftp,"Data conn was not available immediately\n");
      _state(_instate_local,FTP_STOP);
      (pcVar1->proto).ftpc.wait_data_conn = true;
    }
  }
  else {
    if ((instate != FTP_LIST) || (ftpcode != 0x1c2)) {
      Curl_failf((SessionHandle *)ftp,"RETR response: %03d",(ulong)(uint)ftpcode);
      if (local_20 != FTP_RETR || result != 0x226) {
        return CURLE_FTP_COULDNT_RETR_FILE;
      }
      return CURLE_REMOTE_FILE_NOT_FOUND;
    }
    buf[0x18] = '\x02';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    _state(conn,FTP_STOP);
  }
  return data._4_4_;
}

Assistant:

static CURLcode ftp_state_get_resp(struct connectdata *conn,
                                    int ftpcode,
                                    ftpstate instate)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;
  struct FTP *ftp = data->req.protop;
  char *buf = data->state.buffer;

  if((ftpcode == 150) || (ftpcode == 125)) {

    /*
      A;
      150 Opening BINARY mode data connection for /etc/passwd (2241
      bytes).  (ok, the file is being transferred)

      B:
      150 Opening ASCII mode data connection for /bin/ls

      C:
      150 ASCII data connection for /bin/ls (137.167.104.91,37445) (0 bytes).

      D:
      150 Opening ASCII mode data connection for [file] (0.0.0.0,0) (545 bytes)

      E:
      125 Data connection already open; Transfer starting. */

    curl_off_t size=-1; /* default unknown size */


    /*
     * It appears that there are FTP-servers that return size 0 for files when
     * SIZE is used on the file while being in BINARY mode. To work around
     * that (stupid) behavior, we attempt to parse the RETR response even if
     * the SIZE returned size zero.
     *
     * Debugging help from Salvatore Sorrentino on February 26, 2003.
     */

    if((instate != FTP_LIST) &&
       !data->set.prefer_ascii &&
       (ftp->downloadsize < 1)) {
      /*
       * It seems directory listings either don't show the size or very
       * often uses size 0 anyway. ASCII transfers may very well turn out
       * that the transferred amount of data is not the same as this line
       * tells, why using this number in those cases only confuses us.
       *
       * Example D above makes this parsing a little tricky */
      char *bytes;
      bytes=strstr(buf, " bytes");
      if(bytes--) {
        long in=(long)(bytes-buf);
        /* this is a hint there is size information in there! ;-) */
        while(--in) {
          /* scan for the left parenthesis and break there */
          if('(' == *bytes)
            break;
          /* skip only digits */
          if(!ISDIGIT(*bytes)) {
            bytes=NULL;
            break;
          }
          /* one more estep backwards */
          bytes--;
        }
        /* if we have nothing but digits: */
        if(bytes++) {
          /* get the number! */
          size = curlx_strtoofft(bytes, NULL, 0);
        }
      }
    }
    else if(ftp->downloadsize > -1)
      size = ftp->downloadsize;

    if(size > data->req.maxdownload && data->req.maxdownload > 0)
      size = data->req.size = data->req.maxdownload;
    else if((instate != FTP_LIST) && (data->set.prefer_ascii))
      size = -1; /* kludge for servers that understate ASCII mode file size */

    infof(data, "Maxdownload = %" CURL_FORMAT_CURL_OFF_T "\n",
          data->req.maxdownload);

    if(instate != FTP_LIST)
      infof(data, "Getting file with size: %" CURL_FORMAT_CURL_OFF_T "\n",
            size);

    /* FTP download: */
    conn->proto.ftpc.state_saved = instate;
    conn->proto.ftpc.retr_size_saved = size;

    if(data->set.ftp_use_port) {
      bool connected;

      result = AllowServerConnect(conn, &connected);
      if(result)
        return result;

      if(!connected) {
        struct ftp_conn *ftpc = &conn->proto.ftpc;
        infof(data, "Data conn was not available immediately\n");
        state(conn, FTP_STOP);
        ftpc->wait_data_conn = TRUE;
      }
    }
    else
      return InitiateTransfer(conn);
  }
  else {
    if((instate == FTP_LIST) && (ftpcode == 450)) {
      /* simply no matching files in the dir listing */
      ftp->transfer = FTPTRANSFER_NONE; /* don't download anything */
      state(conn, FTP_STOP); /* this phase is over */
    }
    else {
      failf(data, "RETR response: %03d", ftpcode);
      return instate == FTP_RETR && ftpcode == 550?
        CURLE_REMOTE_FILE_NOT_FOUND:
        CURLE_FTP_COULDNT_RETR_FILE;
    }
  }

  return result;
}